

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O2

void __thiscall S2EdgeCrosser::S2EdgeCrosser(S2EdgeCrosser *this,S2Point *a,S2Point *b)

{
  bool bVar1;
  S2LogMessage SStack_28;
  
  this->a_ = a;
  this->b_ = b;
  Vector3<double>::CrossProd(a,b);
  this->have_tangents_ = false;
  (this->a_tangent_).c_[0] = 0.0;
  (this->a_tangent_).c_[1] = 0.0;
  (this->a_tangent_).c_[2] = 0.0;
  (this->b_tangent_).c_[0] = 0.0;
  (this->b_tangent_).c_[1] = 0.0;
  (this->b_tangent_).c_[2] = 0.0;
  this->c_ = (S2Point *)0x0;
  bVar1 = S2::IsUnitLength(a);
  if (bVar1) {
    bVar1 = S2::IsUnitLength(b);
    if (bVar1) {
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe3,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_28.stream_,"Check failed: S2::IsUnitLength(*b) ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe2,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_28.stream_,"Check failed: S2::IsUnitLength(*a) ");
  }
  abort();
}

Assistant:

inline S2EdgeCrosser::S2EdgeCrosser(const S2Point* a, const S2Point* b)
    : a_(a), b_(b), a_cross_b_(a_->CrossProd(*b_)), have_tangents_(false),
      c_(nullptr) {
  S2_DCHECK(S2::IsUnitLength(*a));
  S2_DCHECK(S2::IsUnitLength(*b));
}